

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.h
# Opt level: O0

void __thiscall cmGeneratorTarget::ImportInfo::~ImportInfo(ImportInfo *this)

{
  ImportInfo *this_local;
  
  std::__cxx11::string::~string((string *)&this->SharedDeps);
  std::__cxx11::string::~string((string *)&this->LibrariesProp);
  std::__cxx11::string::~string((string *)&this->Libraries);
  std::__cxx11::string::~string((string *)&this->Languages);
  std::__cxx11::string::~string((string *)&this->ImportLibrary);
  std::__cxx11::string::~string((string *)&this->SOName);
  std::__cxx11::string::~string((string *)&this->Location);
  return;
}

Assistant:

ImportInfo(): NoSOName(false), Multiplicity(0) {}